

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoken.cpp
# Opt level: O2

string * parse_util::get_token(string *__return_storage_ptr__,string *instr,string *open_par)

{
  string asStack_38 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::find((string *)instr,(ulong)open_par);
  std::__cxx11::string::find_first_not_of((char *)instr,0x11f432);
  std::__cxx11::string::substr((ulong)asStack_38,(ulong)instr);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,asStack_38);
  std::__cxx11::string::~string(asStack_38);
  return __return_storage_ptr__;
}

Assistant:

string get_token(const string &instr, const string &open_par)
    {
        string temp;

        string::size_type pos = instr.find(open_par);
        string::size_type pos1 = instr.find_first_not_of(" \n");

        temp = instr.substr(pos1, pos - pos1);

        return temp;
    }